

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_QSound_Reg(VGMPlayer *this)

{
  UINT8 UVar1;
  _func_void_CHIP_DEVICE_ptr_UINT8_UINT16 *p_Var2;
  byte bVar3;
  byte bVar4;
  UINT16 UVar5;
  CHIP_DEVICE *pCVar6;
  QSOUND_WORK *pQVar7;
  UINT16 data;
  UINT8 chn;
  UINT8 offset;
  QSOUND_WORK *qsWork;
  CHIP_DEVICE *cDev;
  UINT8 chipID;
  UINT8 chipType;
  VGMPlayer *this_local;
  
  pCVar6 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,'\0');
  pQVar7 = this->_qsWork;
  if ((pCVar6 != (CHIP_DEVICE *)0x0) &&
     (pQVar7->write != (_func_void_CHIP_DEVICE_ptr_UINT8_UINT16 *)0x0)) {
    if (((pCVar6->flags & 1) != 0) &&
       (bVar4 = this->_fileData[(ulong)this->_filePos + 3], bVar4 < 0x80)) {
      bVar3 = bVar4 >> 3;
      UVar5 = ReadBE16(this->_fileData + (ulong)this->_filePos + 1);
      bVar4 = bVar4 & 7;
      if (bVar4 == 1) {
        this->_qsWork[0].startAddrCache[bVar3] = UVar5;
      }
      else if (bVar4 == 2) {
        if ((this->_qsWork[0].pitchCache[bVar3] == 0) && (UVar5 != 0)) {
          (*pQVar7->write)(pCVar6,bVar3 << 3 | 1,this->_qsWork[0].startAddrCache[bVar3]);
        }
        this->_qsWork[0].pitchCache[bVar3] = UVar5;
      }
      else if (bVar4 == 3) {
        (*pQVar7->write)(pCVar6,bVar3 << 3 | 1,this->_qsWork[0].startAddrCache[bVar3]);
      }
    }
    p_Var2 = pQVar7->write;
    UVar1 = this->_fileData[(ulong)this->_filePos + 3];
    UVar5 = ReadBE16(this->_fileData + (ulong)this->_filePos + 1);
    (*p_Var2)(pCVar6,UVar1,UVar5);
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_QSound_Reg(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = 0;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	QSOUND_WORK* qsWork = &_qsWork[chipID];
	if (cDev == NULL || qsWork->write == NULL)
		return;
	
	if (cDev->flags & 0x01)	// enable hacks for proper playback of old VGMs with a good QSound core
	{
		UINT8 offset = fData[0x03];
		// need to handle three cases, as vgm_cmp can remove writes to both phase and bank
		// registers, depending on version.
		// - start address was written before end/loop, but phase register is written
		// - as above, but phase is not written (we use bank as a backup then)
		// - voice parameters are written during a note (we can't rewrite the address then)
		if (offset < 0x80)
		{
			UINT8 chn = offset >> 3;
			UINT16 data = ReadBE16(&fData[0x01]);
			
			switch(offset & 0x07)
			{
			case 0x01:	// Start Address
				qsWork->startAddrCache[chn] = data;
				break;
			case 0x02:	// Pitch
				// old HLE assumed writing a non-zero value after a zero value was Key On
				if (! qsWork->pitchCache[chn] && data)
					qsWork->write(cDev, (chn << 3) | 0x01, qsWork->startAddrCache[chn]);
				qsWork->pitchCache[chn] = data;
				break;
			case 0x03: // Phase (old HLE also assumed this was Key On)
				qsWork->write(cDev, (chn << 3) | 0x01, qsWork->startAddrCache[chn]);
				break;
			}
		}
	}
	
	qsWork->write(cDev, fData[0x03], ReadBE16(&fData[0x01]));
	return;
}